

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O0

void gimage::anon_unknown_6::loadInternal<unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,char *name,int ds,
               long x,long y,long w,long h)

{
  TiffImage<unsigned_char> *pTVar1;
  int iVar2;
  undefined8 uVar3;
  TiffImage<unsigned_char> *pTVar4;
  TiffImage<unsigned_char> *pTVar5;
  uint *puVar6;
  string *message;
  long lVar7;
  long lVar8;
  long in_RCX;
  uint in_EDX;
  IOException *in_RSI;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RDI;
  long in_R8;
  TiffImage<unsigned_char> *in_R9;
  TiffImage<unsigned_char> *in_stack_00000008;
  long i;
  long k_2;
  uint32_t *p;
  vector<unsigned_int,_std::allocator<unsigned_int>_> pixel;
  long k_1;
  long k;
  uint16_t d;
  TiffImage<unsigned_char> tif;
  TiffImage<unsigned_char> *in_stack_fffffffffffffbf8;
  TiffImage<unsigned_char> *in_stack_fffffffffffffc00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc08;
  TiffImage<unsigned_char> *in_stack_fffffffffffffc10;
  size_type in_stack_fffffffffffffc18;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffc20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  string *in_stack_fffffffffffffc38;
  IOException *in_stack_fffffffffffffc40;
  long in_stack_fffffffffffffc48;
  allocator *paVar9;
  long in_stack_fffffffffffffc50;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  long in_stack_fffffffffffffc98;
  long in_stack_fffffffffffffca0;
  long in_stack_fffffffffffffca8;
  long in_stack_fffffffffffffcb0;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffcb8;
  TiffImage<unsigned_char> *in_stack_fffffffffffffcc0;
  long local_2e0;
  long local_2d8;
  uint *local_2d0;
  allocator local_2c1;
  string local_2c0 [68];
  int in_stack_fffffffffffffd84;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_stack_fffffffffffffd88;
  long local_1f0;
  long local_1e8;
  ushort local_1dc;
  allocator local_181;
  string local_180 [192];
  long local_c0;
  int local_b8;
  int local_b4;
  ushort local_b0;
  ushort local_ae;
  byte local_ab;
  short local_a0;
  TiffImage<unsigned_char> *local_30;
  long local_28;
  long local_20;
  uint local_14;
  IOException *local_10;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  TiffImage<unsigned_char>::TiffImage(in_stack_fffffffffffffcc0,(char *)in_stack_fffffffffffffcb8);
  if (8 < local_ae) {
    uVar3 = __cxa_allocate_exception(0x28);
    iVar2 = (int)((ulong)in_stack_fffffffffffffc48 >> 0x20);
    paVar9 = &local_181;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,(char *)local_10,paVar9);
    std::operator+((char *)in_stack_fffffffffffffc08,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffc00);
    std::operator+(in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00);
    std::__cxx11::to_string(iVar2);
    std::operator+(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    std::operator+(in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00);
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffc38);
    std::operator+(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    gutil::IOException::IOException(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    __cxa_throw(uVar3,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  if ((long)local_30 < 0) {
    local_30 = (TiffImage<unsigned_char> *)((ulong)((local_b8 + local_14) - 1) / (ulong)local_14);
  }
  if ((long)in_stack_00000008 < 0) {
    in_stack_00000008 =
         (TiffImage<unsigned_char> *)((ulong)((local_b4 + local_14) - 1) / (ulong)local_14);
  }
  if (((local_a0 == 0) || (local_a0 == 1)) || (local_a0 == 2)) {
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
               CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
               CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
               in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    if ((local_ab & 1) == 0) {
      for (local_1f0 = 0; local_1f0 < (long)in_stack_00000008; local_1f0 = local_1f0 + 1) {
        readRow<unsigned_char>
                  (in_stack_fffffffffffffc20,(uint32_t)(in_stack_fffffffffffffc18 >> 0x20),
                   in_stack_fffffffffffffc10,(uint32_t)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                   (uint16_t)((ulong)in_stack_fffffffffffffc08 >> 0x10));
      }
    }
    else {
      for (local_1dc = 0; local_1dc < local_b0; local_1dc = local_1dc + 1) {
        for (local_1e8 = 0; local_1e8 < (long)in_stack_00000008; local_1e8 = local_1e8 + 1) {
          readRow<unsigned_char>
                    (in_stack_fffffffffffffc20,(uint32_t)(in_stack_fffffffffffffc18 >> 0x20),
                     in_stack_fffffffffffffc10,(uint32_t)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                     (uint16_t)((ulong)in_stack_fffffffffffffc08 >> 0x10));
        }
      }
    }
    if (1 < (int)local_14) {
      downscaleImage<unsigned_char>(in_stack_fffffffffffffd88,in_stack_fffffffffffffd84);
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator=
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 in_stack_fffffffffffffc00,
                 (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 in_stack_fffffffffffffbf8);
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 in_stack_fffffffffffffc10);
    }
    pTVar5 = local_30;
    if (((local_20 != 0) || (local_28 != 0)) ||
       ((pTVar4 = (TiffImage<unsigned_char> *)
                  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_8),
        pTVar1 = in_stack_00000008, pTVar5 != pTVar4 ||
        (pTVar5 = (TiffImage<unsigned_char> *)
                  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_8),
        pTVar1 != pTVar5)))) {
      cropImage<unsigned_char>
                (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                 in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator=
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 in_stack_fffffffffffffc00,
                 (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 in_stack_fffffffffffffbf8);
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 in_stack_fffffffffffffc10);
    }
  }
  else {
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x19ed61);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc20,
               in_stack_fffffffffffffc18,(allocator_type *)in_stack_fffffffffffffc10);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x19ed87);
    puVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x19edb7);
    iVar2 = TIFFReadRGBAImageOriented(local_c0,local_b8,local_b4,puVar6,1);
    if (iVar2 < 1) {
      message = (string *)__cxa_allocate_exception(0x28);
      paVar9 = &local_2c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c0,(char *)local_10,paVar9);
      std::operator+((char *)in_stack_fffffffffffffc08,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc00);
      gutil::IOException::IOException(local_10,message);
      __cxa_throw(message,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
    }
    Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize
              ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)CONCAT44(iVar2,local_b4)
               ,CONCAT44(local_b8,in_stack_fffffffffffffc58),local_c0,in_stack_fffffffffffffc48);
    local_2d0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x19ef82);
    for (local_2d8 = 0;
        lVar7 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_8),
        local_2d8 < lVar7; local_2d8 = local_2d8 + 1) {
      local_2e0 = 0;
      while (lVar7 = local_2e0,
            lVar8 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_8),
            lVar7 < lVar8) {
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                  (local_8,local_2e0,local_2d8,0,(store_t)*local_2d0);
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                  (local_8,local_2e0,local_2d8,1,*(store_t *)((long)local_2d0 + 1));
        Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                  (local_8,local_2e0,local_2d8,2,*(store_t *)((long)local_2d0 + 2));
        local_2d0 = local_2d0 + 1;
        local_2e0 = local_2e0 + 1;
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffc10);
    if (1 < (int)local_14) {
      downscaleImage<unsigned_char>(in_stack_fffffffffffffd88,in_stack_fffffffffffffd84);
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator=
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 in_stack_fffffffffffffc00,
                 (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 in_stack_fffffffffffffbf8);
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 in_stack_fffffffffffffc10);
    }
    if (((local_20 != 0) || (local_28 != 0)) ||
       ((pTVar5 = local_30,
        in_stack_fffffffffffffc10 =
             (TiffImage<unsigned_char> *)
             Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_8),
        pTVar5 != in_stack_fffffffffffffc10 ||
        (in_stack_fffffffffffffbf8 = in_stack_00000008,
        in_stack_fffffffffffffc00 =
             (TiffImage<unsigned_char> *)
             Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_8),
        in_stack_fffffffffffffbf8 != in_stack_fffffffffffffc00)))) {
      cropImage<unsigned_char>
                (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                 in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::operator=
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 in_stack_fffffffffffffc00,
                 (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 in_stack_fffffffffffffbf8);
      Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::~Image
                ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)
                 in_stack_fffffffffffffc10);
    }
  }
  TiffImage<unsigned_char>::~TiffImage(in_stack_fffffffffffffc00);
  return;
}

Assistant:

void loadInternal(Image<T> &image, const char *name, int ds, long x, long y,
  long w, long h)
{
  TiffImage<T> tif(name);

  if (tif.bits > 8*sizeof(T))
  {
    throw gutil::IOException("Image "+std::string(name)+" has "+
      std::to_string(tif.bits)+" bits per sample, but target image only "+std::to_string(8*sizeof(T)));
  }

  if (w < 0)
  {
    w=(tif.width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(tif.height+ds-1)/ds;
  }

  if (tif.photometric == PHOTOMETRIC_MINISWHITE || tif.photometric == PHOTOMETRIC_MINISBLACK ||
    tif.photometric == PHOTOMETRIC_RGB)
  {
    // loading full image (could be optimised with downscaling and cropping
    // while loading row-wise)

    image.setSize(tif.width, tif.height, tif.depth);

    if (tif.is_planar)
    {
      for (uint16_t d=0; d<tif.depth; d++)
      {
        for (long k=0; k<h; k++)
        {
          readRow(image, static_cast<uint32_t>(k), tif, static_cast<uint32_t>(k), d);
        }
      }
    }
    else
    {
      for (long k=0; k<h; k++)
      {
        readRow(image, static_cast<uint32_t>(k), tif, static_cast<uint32_t>(k), 0);
      }
    }

    // optionally downscale

    if (ds > 1)
    {
      image=gimage::downscaleImage(image, ds);
    }

    // optionally copy part

    if (x != 0 || y != 0 || w != image.getWidth() || h != image.getHeight())
    {
      image=gimage::cropImage(image, x, y, w, h);
    }
  }
  else
  {
    // load full image

    {
      std::vector<uint32_t> pixel(tif.width*tif.height);
      if (TIFFReadRGBAImageOriented(tif.tif, tif.width, tif.height, pixel.data(),
        ORIENTATION_TOPLEFT, 1) <= 0)
      {
        throw gutil::IOException("Cannot load image "+std::string(name));
      }

      // convert into RGB image

      image.setSize(tif.width, tif.height, 3);

      uint32_t *p=pixel.data();
      for (long k=0; k<image.getHeight(); k++)
      {
        for (long i=0; i<image.getWidth(); i++)
        {
          image.set(i, k, 0, static_cast<T>(TIFFGetR(*p)));
          image.set(i, k, 1, static_cast<T>(TIFFGetG(*p)));
          image.set(i, k, 2, static_cast<T>(TIFFGetB(*p)));
          p++;
        }
      }
    }

    // optionally downscale

    if (ds > 1)
    {
      image=gimage::downscaleImage(image, ds);
    }

    // optionally copy part

    if (x != 0 || y != 0 || w != image.getWidth() || h != image.getHeight())
    {
      image=gimage::cropImage(image, x, y, w, h);
    }
  }
}